

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O3

void __thiscall
SequenceDistanceGraph::load_from_gfa1(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  iterator iVar9;
  sgNodeID_t sVar10;
  mapped_type *pmVar11;
  istream *piVar12;
  iterator iVar13;
  int *piVar14;
  long lVar15;
  mapped_type *pmVar16;
  size_type sVar17;
  runtime_error *this_01;
  long *plVar18;
  logic_error *plVar19;
  long lVar20;
  size_type *psVar21;
  int32_t d;
  ulong uVar22;
  long n1;
  string gfa_source;
  string line;
  string gfa_dest;
  string gap_id;
  string seq;
  string name;
  string seq_location;
  string gfa_length;
  string gfa_cigar;
  string gfa_destdir;
  string gfa_rtype;
  string gfa_star;
  string gfa_sourcedir;
  string gap_dir;
  istringstream gap_ss;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  istringstream iss;
  ulong local_6e0;
  key_type local_6d8;
  char *local_6b8;
  ulong local_6b0;
  char local_6a8;
  undefined7 uStack_6a7;
  long local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  key_type local_670;
  key_type local_650;
  long *local_630;
  char *local_628;
  long local_620 [2];
  vector<Node,_std::allocator<Node>_> *local_610;
  key_type local_608;
  undefined1 *local_5e8;
  long local_5e0;
  undefined1 local_5d8;
  undefined7 uStack_5d7;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8;
  undefined7 uStack_5b7;
  char *local_5a8;
  ulong local_5a0;
  char local_598;
  undefined7 uStack_597;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558;
  undefined7 uStack_557;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8;
  undefined7 uStack_4f7;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8;
  undefined7 uStack_4d7;
  Node local_4c8;
  Node local_490;
  Node local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [3];
  ios_base local_368 [264];
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  Node local_220;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_6b8 = &local_6a8;
  local_6b0 = 0;
  local_6a8 = '\0';
  poVar8 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Graph fasta filesname: ",0x17);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->fasta_filename)._M_dataplus._M_p,
                      (this->fasta_filename)._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  poVar8 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Loading sequences from ",0x17);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->fasta_filename)._M_dataplus._M_p,
                      (this->fasta_filename)._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_1e8._M_buckets = &local_1e8._M_single_bucket;
  local_1e8._M_bucket_count = 1;
  local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1e8._M_element_count = 0;
  local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1e8._M_rehash_policy._M_next_resize = 0;
  local_1e8._M_single_bucket = (__node_base_ptr)0x0;
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_608._M_string_length = 0;
  local_608.field_2._M_local_buf[0] = '\0';
  local_630 = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"");
  std::__cxx11::string::reserve((ulong)&local_630);
  this_00 = &this->oldnames_to_ids;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  paVar1 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->oldnames,
             &local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_610 = &this->nodes;
  std::vector<Node,_std::allocator<Node>_>::_M_erase_at_end
            (local_610,
             (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::_M_erase_at_end(&(this->super_DistanceGraph).links,
                    (this->super_DistanceGraph).links.
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  paVar2 = &local_220.sequence.field_2;
  local_220.sequence._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,local_1b0._M_dataplus._M_p,
             local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
  local_220.status = Deleted;
  local_220.support.type = Undefined;
  local_220.support.index = 0;
  local_220.support.id = 0;
  add_node(this,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.sequence._M_dataplus._M_p != paVar2) {
    operator_delete(local_220.sequence._M_dataplus._M_p,
                    local_220.sequence.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  lVar15 = *(long *)(*(long *)fastaf + -0x18);
  if (((byte)fastaf[lVar15 + 0x20] & 2) == 0) {
    local_698 = 0;
    do {
      cVar5 = std::ios::widen((char)lVar15 + (char)fastaf);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)fastaf,(string *)&local_6b8,cVar5);
      if ((((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) == 0) &&
         (*local_6b8 != '>')) {
        std::__cxx11::string::_M_append((char *)&local_630,(ulong)local_6b8);
      }
      else {
        if (local_608._M_string_length != 0) {
          iVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_608);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            plVar19 = (logic_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_3e0,"sequence ",&local_608);
            plVar18 = (long *)std::__cxx11::string::append((char *)local_3e0);
            local_1b0._M_dataplus._M_p = (pointer)*plVar18;
            psVar21 = (size_type *)(plVar18 + 2);
            if ((size_type *)local_1b0._M_dataplus._M_p == psVar21) {
              local_1b0.field_2._M_allocated_capacity = *psVar21;
              local_1b0.field_2._8_8_ = plVar18[3];
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar21;
            }
            local_1b0._M_string_length = plVar18[1];
            *plVar18 = (long)psVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            std::logic_error::logic_error(plVar19,(string *)&local_1b0);
            __cxa_throw(plVar19,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          local_4c8.sequence._M_dataplus._M_p = (pointer)&local_4c8.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,local_630,local_628 + (long)local_630);
          local_4c8.status = Active;
          local_4c8.support.type = Undefined;
          local_4c8.support.index = 0;
          local_4c8.support.id = 0;
          sVar10 = add_node(this,&local_4c8);
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_608);
          *pmVar11 = sVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8.sequence._M_dataplus._M_p != &local_4c8.sequence.field_2) {
            operator_delete(local_4c8.sequence._M_dataplus._M_p,
                            local_4c8.sequence.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->oldnames,&local_608);
          bVar6 = Node::is_canonical((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + -1);
          if (!bVar6) {
            Node::make_rc((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1);
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,&local_608);
            lVar15 = *pmVar11;
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,&local_608);
            *pmVar11 = -lVar15;
            local_698 = local_698 + 1;
          }
        }
        local_608._M_string_length = 0;
        *local_608._M_dataplus._M_p = '\0';
        if (1 < local_6b0) {
          uVar22 = 1;
          do {
            if (local_6b8[uVar22] == ' ') break;
            std::__cxx11::string::push_back((char)&local_608);
            uVar22 = uVar22 + 1;
          } while (uVar22 < local_6b0);
        }
        std::__cxx11::string::_M_replace((ulong)&local_630,0,local_628,0x222908);
      }
      lVar15 = *(long *)(*(long *)fastaf + -0x18);
    } while (((byte)fastaf[lVar15 + 0x20] & 2) == 0);
  }
  else {
    local_698 = 0;
  }
  poVar8 = sdglib::OutputLog(INFO,true);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," nodes loaded (",0xf);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," canonised).",0xc);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_548 = &local_538;
  local_540 = 0;
  local_538 = 0;
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  local_6d8._M_string_length = 0;
  local_6d8.field_2._M_local_buf[0] = '\0';
  local_508 = &local_4f8;
  local_500 = 0;
  local_4f8 = 0;
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  local_670._M_string_length = 0;
  local_670.field_2._M_local_buf[0] = '\0';
  local_568 = &local_558;
  local_560 = 0;
  local_558 = 0;
  local_5a8 = &local_598;
  local_5a0 = 0;
  local_598 = '\0';
  local_528 = &local_518;
  local_520 = 0;
  local_518 = 0;
  local_5c8 = &local_5b8;
  local_5c0 = 0;
  local_5b8 = 0;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  local_650._M_string_length = 0;
  local_650.field_2._M_local_buf[0] = '\0';
  local_4e8 = &local_4d8;
  local_4e0 = 0;
  local_4d8 = 0;
  local_5e8 = &local_5d8;
  local_5e0 = 0;
  local_5d8 = 0;
  uVar22 = 0;
  local_6e0 = 0;
  do {
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)gfaf + -0x18) + (char)gfaf);
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)gfaf,(string *)&local_6b8,cVar5);
    if ((((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) ||
       (((byte)gfaf[*(long *)(*(long *)gfaf + -0x18) + 0x20] & 2) != 0)) {
      if ((float)uVar22 * 0.5 < (float)local_6e0) {
        poVar8 = sdglib::OutputLog(WARN,true);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"Warning: The loaded graph contains ",0x23);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," non-overlapping links out of ",0x1e);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      poVar8 = sdglib::OutputLog(INFO,true);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," nodes after connecting with ",0x1d);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," links.",7);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (local_5e8 != &local_5d8) {
        operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
      }
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,CONCAT71(uStack_4d7,local_4d8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p,
                        CONCAT71(local_650.field_2._M_allocated_capacity._1_7_,
                                 local_650.field_2._M_local_buf[0]) + 1);
      }
      if (local_5c8 != &local_5b8) {
        operator_delete(local_5c8,CONCAT71(uStack_5b7,local_5b8) + 1);
      }
      if (local_528 != &local_518) {
        operator_delete(local_528,CONCAT71(uStack_517,local_518) + 1);
      }
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p,
                        CONCAT71(local_670.field_2._M_allocated_capacity._1_7_,
                                 local_670.field_2._M_local_buf[0]) + 1);
      }
      if (local_508 != &local_4f8) {
        operator_delete(local_508,CONCAT71(uStack_4f7,local_4f8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,
                        CONCAT71(local_6d8.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.field_2._M_local_buf[0]) + 1);
      }
      if (local_548 != &local_538) {
        operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
      }
      if (local_630 != local_620) {
        operator_delete(local_630,local_620[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p,
                        CONCAT71(local_608.field_2._M_allocated_capacity._1_7_,
                                 local_608.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1e8);
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
      }
      return;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1b0,(string *)&local_6b8,_S_in);
    std::operator>>((istream *)&local_1b0,(string *)&local_548);
    iVar7 = std::__cxx11::string::compare((char *)&local_548);
    if (iVar7 == 0) {
      std::operator>>((istream *)&local_1b0,(string *)&local_6d8);
      std::operator>>((istream *)&local_1b0,(string *)&local_528);
      std::operator>>((istream *)&local_1b0,(string *)&local_5c8);
      if ((abStack_190[*(long *)(local_1b0._M_dataplus._M_p + -0x18)] & 2) == 0) {
        std::operator>>((istream *)&local_1b0,(string *)&local_5e8);
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_528);
      if (iVar7 != 0) {
        plVar19 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar19,"Sequences should be in a separate file.");
        __cxa_throw(plVar19,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_528);
      if ((iVar7 == 0) && (local_5e0 == 0)) {
        std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_5c8);
        _Var4._M_p = local_3e0[0]._M_dataplus._M_p;
        piVar14 = __errno_location();
        iVar7 = *piVar14;
        *piVar14 = 0;
        lVar15 = strtol(_Var4._M_p,(char **)&local_690,10);
        if (local_690._M_dataplus._M_p == _Var4._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar15 - 0x80000000U) && (*piVar14 != 0x22)) {
          if (*piVar14 == 0) {
            *piVar14 = iVar7;
          }
          pmVar16 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_1e8,&local_6d8);
          *pmVar16 = (mapped_type)lVar15;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
            operator_delete(local_3e0[0]._M_dataplus._M_p,
                            local_3e0[0].field_2._M_allocated_capacity + 1);
          }
          goto LAB_0016f04a;
        }
        std::__throw_out_of_range("stoi");
LAB_0016f4c7:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_588,&local_670," has not been seen in ");
        std::operator+(&local_690,&local_588,&this->filename);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_690);
        local_3e0[0]._M_dataplus._M_p = (pointer)*plVar18;
        psVar21 = (size_type *)(plVar18 + 2);
        if ((size_type *)local_3e0[0]._M_dataplus._M_p == psVar21) {
          local_3e0[0].field_2._0_8_ = *psVar21;
          local_3e0[0].field_2._8_8_ = plVar18[3];
          local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
        }
        else {
          local_3e0[0].field_2._0_8_ = *psVar21;
        }
        local_3e0[0]._M_string_length = plVar18[1];
        *plVar18 = (long)psVar21;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)local_3e0);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,&local_6d8);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_5c8);
        _Var4._M_p = local_3e0[0]._M_dataplus._M_p;
        piVar14 = __errno_location();
        iVar7 = *piVar14;
        *piVar14 = 0;
        sVar17 = strtol(_Var4._M_p,(char **)&local_690,10);
        if (local_690._M_dataplus._M_p == _Var4._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < sVar17 - 0x80000000) && (*piVar14 != 0x22)) {
          if (*piVar14 == 0) {
            *piVar14 = iVar7;
          }
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_6d8);
          lVar15 = *pmVar11;
          lVar20 = -lVar15;
          if (0 < lVar15) {
            lVar20 = lVar15;
          }
          sVar3 = (local_610->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar20].sequence._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
            operator_delete(local_3e0[0]._M_dataplus._M_p,
                            local_3e0[0].field_2._M_allocated_capacity + 1);
          }
          if (sVar3 != sVar17) goto LAB_0016f56a;
          goto LAB_0016f04a;
        }
        std::__throw_out_of_range("stoi");
LAB_0016f56a:
        plVar19 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_400,"Different length in node and fasta for sequence: ",&local_6d8);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_400);
        local_420._M_dataplus._M_p = (pointer)*plVar18;
        psVar21 = (size_type *)(plVar18 + 2);
        if ((size_type *)local_420._M_dataplus._M_p == psVar21) {
          local_420.field_2._M_allocated_capacity = *psVar21;
          local_420.field_2._8_8_ = plVar18[3];
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        }
        else {
          local_420.field_2._M_allocated_capacity = *psVar21;
        }
        local_420._M_string_length = plVar18[1];
        *plVar18 = (long)psVar21;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_5c8);
        std::operator+(&local_588,&local_420,&local_240);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_588);
        local_690._M_dataplus._M_p = (pointer)*plVar18;
        psVar21 = (size_type *)(plVar18 + 2);
        if ((size_type *)local_690._M_dataplus._M_p == psVar21) {
          local_690.field_2._M_allocated_capacity = *psVar21;
          local_690.field_2._8_8_ = plVar18[3];
          local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
        }
        else {
          local_690.field_2._M_allocated_capacity = *psVar21;
        }
        local_690._M_string_length = plVar18[1];
        *plVar18 = (long)psVar21;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_6d8);
        std::__cxx11::to_string
                  (&local_260,
                   (local_610->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                   super__Vector_impl_data._M_start[*pmVar11].sequence._M_string_length);
        std::operator+(local_3e0,&local_690,&local_260);
        std::logic_error::logic_error(plVar19,(string *)local_3e0);
        __cxa_throw(plVar19,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
LAB_0016f04a:
      local_5e0 = 0;
      *local_5e8 = 0;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_548);
      if (iVar7 == 0) {
        std::operator>>((istream *)&local_1b0,(string *)&local_6d8);
        std::operator>>((istream *)&local_1b0,(string *)&local_508);
        std::operator>>((istream *)&local_1b0,(string *)&local_670);
        std::operator>>((istream *)&local_1b0,(string *)&local_568);
        std::operator>>((istream *)&local_1b0,(string *)&local_5a8);
        iVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_1e8,&local_670);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur != (__node_type *)0x0) {
          cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)gfaf + -0x18) + (char)gfaf);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)gfaf,(string *)&local_6b8,cVar5);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3e0,(string *)&local_6b8,_S_in);
          std::operator>>((istream *)local_3e0,(string *)&local_548);
          std::operator>>((istream *)local_3e0,(string *)&local_650);
          std::operator>>((istream *)local_3e0,(string *)&local_4e8);
          std::operator>>((istream *)local_3e0,(string *)&local_670);
          std::operator>>((istream *)local_3e0,(string *)&local_568);
          std::operator>>((istream *)local_3e0,(string *)&local_5a8);
          std::__cxx11::istringstream::~istringstream((istringstream *)local_3e0);
          std::ios_base::~ios_base(local_368);
        }
        iVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_1e8,&local_650);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_6d8);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"");
            local_458.sequence._M_dataplus._M_p = (pointer)&local_458.sequence.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458,local_3e0[0]._M_dataplus._M_p,
                       local_3e0[0]._M_dataplus._M_p + local_3e0[0]._M_string_length);
            local_458.status = Active;
            local_458.support.type = Undefined;
            local_458.support.index = 0;
            local_458.support.id = 0;
            sVar10 = add_node(this,&local_458);
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,&local_6d8);
            *pmVar11 = sVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458.sequence._M_dataplus._M_p != &local_458.sequence.field_2) {
              operator_delete(local_458.sequence._M_dataplus._M_p,
                              local_458.sequence.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
              operator_delete(local_3e0[0]._M_dataplus._M_p,
                              local_3e0[0].field_2._M_allocated_capacity + 1);
            }
          }
          iVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_670);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"");
            local_490.sequence._M_dataplus._M_p = (pointer)&local_490.sequence.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_490,local_3e0[0]._M_dataplus._M_p,
                       local_3e0[0]._M_dataplus._M_p + local_3e0[0]._M_string_length);
            local_490.status = Active;
            local_490.support.type = Undefined;
            local_490.support.index = 0;
            local_490.support.id = 0;
            sVar10 = add_node(this,&local_490);
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,&local_670);
            *pmVar11 = sVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490.sequence._M_dataplus._M_p != &local_490.sequence.field_2) {
              operator_delete(local_490.sequence._M_dataplus._M_p,
                              local_490.sequence.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
              operator_delete(local_3e0[0]._M_dataplus._M_p,
                              local_3e0[0].field_2._M_allocated_capacity + 1);
            }
          }
        }
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_6d8);
        lVar15 = *pmVar11;
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_670);
        lVar20 = *pmVar11;
        iVar7 = std::__cxx11::string::compare((char *)&local_508);
        n1 = -lVar15;
        if (iVar7 != 0) {
          n1 = lVar15;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_568);
        lVar15 = -lVar20;
        if (iVar7 != 0) {
          lVar15 = lVar20;
        }
        d = 0;
        if ((1 < local_5a0) && (d = 0, local_5a8[local_5a0 - 1] == 'M')) {
          iVar7 = atoi(local_5a8);
          d = -iVar7;
          local_6e0 = local_6e0 + (iVar7 < 1);
        }
        if (local_650._M_string_length != 0) {
          iVar13 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_1e8,&local_650);
          if (iVar13.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_0016f4c7;
          d = *(int32_t *)
               ((long)iVar13.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                      ._M_cur + 0x28);
          local_650._M_string_length = 0;
          *local_650._M_dataplus._M_p = '\0';
        }
        bVar6 = DistanceGraph::are_connected(&this->super_DistanceGraph,n1,lVar15);
        if (!bVar6) {
          DistanceGraph::add_link(&this->super_DistanceGraph,n1,lVar15,d,(Support)ZEXT816(0));
          uVar22 = uVar22 + 1;
        }
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
    std::ios_base::~ios_base(local_138);
  } while( true );
}

Assistant:

void SequenceDistanceGraph::load_from_gfa1(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filesname: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,gap_id,gap_dir,seq_location;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_star;
            iss >> gfa_length; // parse to number
            if (!iss.eof()) iss >> seq_location;
            if (gfa_star != "*") {
                throw std::logic_error("Sequences should be in a separate file.");
            }

            if (gfa_star == "*" and seq_location.empty()) {
                gap_dist[gfa_source] = std::stoi(gfa_length.substr(5));
            } else {
                // Check equal length seq and node length reported in gfa
                if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                    if (std::stoi(gfa_length.substr(5)) !=
                        nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                        throw std::logic_error(
                                "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                                gfa_length.substr(5) + ", fasta: " +
                                std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                    }
                }
            }
            seq_location.clear();
        } else if (gfa_rtype == "L"){
            iss >> gfa_source;
            iss >> gfa_sourcedir;
            iss >> gfa_dest;
            iss >> gfa_destdir;
            iss >> gfa_cigar;

            if (gap_dist.find(gfa_dest) != gap_dist.end()) {
                std::getline(gfaf, line);
                std::istringstream gap_ss(line);
                gap_ss >> gfa_rtype;
                gap_ss >> gap_id;        // Ignore gap_id x2
                gap_ss >> gap_dir;     // Ignore gap_dir x2
                gap_ss >> gfa_dest;        // Read dest
                gap_ss >> gfa_destdir;     // Read dest_dir
                gap_ss >> gfa_cigar;       // Ignore cigar
            }
            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (gap_dist.find(gap_id) == gap_dist.end()) {
                if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_source] = add_node(Node(""));
                    //std::cout<<"added source!" <<source<<std::endl;
                }
                if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_dest] = add_node(Node(""));
                    //std::cout<<"added dest! "<<dest<<std::endl;
                }
            }
            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;
            dist=0;
            if (gfa_cigar.size()>1 and gfa_cigar[gfa_cigar.size()-1]=='M') {
                //TODO: better checks for M
                dist=-atoi(gfa_cigar.c_str());
                if (dist>=0) {
                    dist_egt0++;
                }
            }

            if (!gap_id.empty()) {
                const auto d = gap_dist.find(gap_id);
                if (d != gap_dist.cend()) {
                    dist = d->second;
                } else {
                    throw std::runtime_error(gfa_dest + " has not been seen in " + filename +
                                             " yet, please ensure gaps are defined before being referenced");
                }
                gap_id.clear();
            }
            if (not are_connected(src_id,dest_id)) {
                add_link(src_id, dest_id, dist);
                ++lcount;
            }
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;
}